

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnf.hpp
# Opt level: O0

void __thiscall bal::Cnf::append_clause(Cnf *this,literalid_t *literals,clause_size_t literals_size)

{
  clause_size_t cVar1;
  undefined1 local_38 [8];
  insertion_point_t l0_insertion_point;
  literalid_t *dst_literals;
  clause_size_t literals_size_local;
  literalid_t *literals_local;
  Cnf *this_local;
  
  Container<unsigned_int>::reserve(&this->clauses_,literals_size + 1);
  (this->clauses_).data_[(this->clauses_).size_] = (uint)literals_size;
  l0_insertion_point._8_8_ = (this->clauses_).data_ + (ulong)(this->clauses_).size_ + 1;
  std::copy<unsigned_int_const*,unsigned_int*>
            (literals,literals + (int)(uint)literals_size,(uint *)l0_insertion_point._8_8_);
  cVar1 = normalize_clause((uint32_t *)l0_insertion_point._8_8_,literals_size);
  (this->clauses_).data_[(this->clauses_).size_] = (uint)cVar1;
  local_38._4_4_ = 0xffffffff;
  __append_clause<false>(this,(insertion_point_t *)local_38);
  return;
}

Assistant:

inline void append_clause(const literalid_t* const literals, const clause_size_t literals_size) {
            clauses_.reserve(literals_size + 1);
            clauses_.data_[clauses_.size_] = literals_size; // no flags
            literalid_t* const dst_literals = clauses_.data_ + clauses_.size_ + 1;
            std::copy(literals, literals + literals_size, dst_literals);
            clauses_.data_[clauses_.size_] = normalize_clause(dst_literals, literals_size);
            l0_index_t::insertion_point_t l0_insertion_point;
            __insertion_point_t_init(l0_insertion_point);
            __append_clause<false>(l0_insertion_point);
        }